

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<char>::write_int<int,fmt::FormatSpec>
          (BasicWriter<char> *this,int value,FormatSpec spec)

{
  undefined4 uVar1;
  lconv *plVar2;
  size_t __n;
  CharPtr __dest;
  byte *pbVar3;
  CharPtr pcVar4;
  byte bVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  char prefix [4];
  undefined4 local_58;
  uint local_54;
  size_t local_50;
  char *local_48;
  CharPtr local_40;
  long local_38;
  
  uVar1 = spec._20_4_;
  uVar7 = (ulong)(uint)value;
  local_58 = 0;
  if (value < 0) {
    local_58 = 0x2d;
    uVar7 = (ulong)(uint)-value;
LAB_001611ab:
    uVar9 = 1;
  }
  else {
    uVar9 = 0;
    if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      bVar5 = 0x2b;
      if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
        bVar5 = 0x20;
      }
      local_58 = (uint)bVar5;
      goto LAB_001611ab;
    }
  }
  uVar10 = (uint)uVar7;
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_001614a1;
      if (spec.type_ != 'B') goto code_r0x001615b1;
    }
    else {
      if (spec.type_ == 'X') {
LAB_00161430:
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          uVar13 = (ulong)uVar9;
          *(undefined1 *)((long)&local_58 + uVar13) = 0x30;
          uVar9 = uVar9 | 2;
          *(char *)((long)&local_58 + uVar13 + 1) = spec.type_;
        }
        uVar10 = 0;
        uVar13 = uVar7;
        do {
          uVar10 = uVar10 + 1;
          uVar11 = (uint)uVar13;
          uVar13 = uVar13 >> 4;
        } while (0xf < uVar11);
        pcVar4 = prepare_int_buffer<fmt::FormatSpec>(this,uVar10,&spec,(char *)&local_58,uVar9);
        pcVar6 = "0123456789ABCDEF";
        if (spec.type_ == 'x') {
          pcVar6 = "0123456789abcdef";
        }
        do {
          uVar9 = (uint)uVar7;
          *pcVar4 = pcVar6[uVar9 & 0xf];
          pcVar4 = pcVar4 + -1;
          uVar7 = uVar7 >> 4;
        } while (0xf < uVar9);
        return;
      }
      if (spec.type_ != 'b') goto code_r0x001615b1;
    }
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      uVar13 = (ulong)uVar9;
      *(undefined1 *)((long)&local_58 + uVar13) = 0x30;
      uVar9 = uVar9 | 2;
      *(char *)((long)&local_58 + uVar13 + 1) = spec.type_;
    }
    uVar10 = 0;
    uVar13 = uVar7;
    do {
      uVar10 = uVar10 + 1;
      uVar11 = (uint)uVar13;
      uVar13 = uVar13 >> 1;
    } while (1 < uVar11);
    pbVar3 = (byte *)prepare_int_buffer<fmt::FormatSpec>(this,uVar10,&spec,(char *)&local_58,uVar9);
    do {
      uVar9 = (uint)uVar7;
      *pbVar3 = (byte)uVar7 & 1 | 0x30;
      pbVar3 = pbVar3 + -1;
      uVar7 = uVar7 >> 1;
    } while (1 < uVar9);
  }
  else {
    if (0x6e < (byte)spec.type_) {
      if (spec.type_ == 'o') {
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          uVar13 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
          *(undefined1 *)((long)&local_58 + uVar13) = 0x30;
        }
        uVar10 = 0;
        uVar13 = uVar7;
        do {
          uVar10 = uVar10 + 1;
          uVar11 = (uint)uVar13;
          uVar13 = uVar13 >> 3;
        } while (7 < uVar11);
        pbVar3 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                   (this,uVar10,&spec,(char *)&local_58,uVar9);
        do {
          uVar9 = (uint)uVar7;
          *pbVar3 = (byte)uVar7 & 7 | 0x30;
          pbVar3 = pbVar3 + -1;
          uVar7 = uVar7 >> 3;
        } while (7 < uVar9);
        return;
      }
      if (spec.type_ == 'x') goto LAB_00161430;
code_r0x001615b1:
      internal::report_unknown_type(spec.super_AlignSpec.super_WidthSpec.fill_._3_1_,spec._8_8_);
    }
    if (spec.type_ != 'd') {
      if (spec.type_ == 'n') {
        uVar11 = 0x1f;
        if ((uVar10 | 1) != 0) {
          for (; (uVar10 | 1) >> uVar11 == 0; uVar11 = uVar11 - 1) {
          }
        }
        uVar11 = (uVar11 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
        plVar2 = localeconv();
        local_48 = plVar2->thousands_sep;
        __n = strlen(local_48);
        uVar11 = uVar11 - (uVar10 < internal::BasicData<void>::POWERS_OF_10_32[uVar11]);
        pcVar4 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar11 + (int)__n * (uVar11 / 3) + 1,&spec,(char *)&local_58,uVar9)
        ;
        pcVar4 = pcVar4 + 1;
        if (uVar10 < 100) {
          bVar16 = false;
        }
        else {
          local_38 = -__n;
          iVar8 = -1;
          uVar15 = 1;
          iVar12 = -2;
          uVar13 = 2;
          local_50 = __n;
          do {
            uVar9 = (uint)uVar7;
            uVar10 = (uint)(uVar7 / 100);
            uVar14 = (ulong)((uVar9 + (int)(uVar7 / 100) * -100) * 2);
            pcVar4[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                         [uVar14 + 1];
            __dest = pcVar4 + -1;
            if (((int)(uVar15 / 3) * 3 + iVar8 == 0) && (__dest = pcVar4 + -1 + local_38, __n != 0))
            {
              local_54 = uVar9;
              local_40 = __dest;
              memmove(__dest,local_48,local_50);
              __dest = local_40;
              __n = local_50;
              uVar9 = local_54;
            }
            __dest[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                         [uVar14];
            pcVar4 = __dest + -1;
            if (((int)(uVar13 / 3) * 3 + iVar12 == 0) && (pcVar4 = pcVar4 + local_38, __n != 0)) {
              local_54 = uVar9;
              memmove(pcVar4,local_48,local_50);
              __n = local_50;
              uVar9 = local_54;
            }
            iVar8 = iVar8 + -2;
            uVar11 = (int)uVar15 + 2;
            uVar15 = (ulong)uVar11;
            iVar12 = iVar12 + -2;
            uVar13 = (ulong)((int)uVar13 + 2);
            uVar7 = uVar7 / 100;
          } while (9999 < uVar9);
          bVar16 = iVar8 + (uVar11 / 3) * 3 == 0;
        }
        if (uVar10 < 10) {
          pcVar4[-1] = (byte)uVar10 | 0x30;
          return;
        }
        pcVar4[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [((ulong)uVar10 * 2 & 0xffffffff) + 1];
        pcVar4 = pcVar4 + -1;
        if ((bVar16) && (pcVar4 = pcVar4 + -__n, __n != 0)) {
          memmove(pcVar4,local_48,__n);
        }
        pcVar4[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [(ulong)uVar10 * 2];
        return;
      }
      goto code_r0x001615b1;
    }
LAB_001614a1:
    uVar11 = 0x1f;
    if ((uVar10 | 1) != 0) {
      for (; (uVar10 | 1) >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar11 = (uVar11 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    pcVar4 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar11 - (uVar10 < internal::BasicData<void>::POWERS_OF_10_32[uVar11])
                             ) + 1,&spec,(char *)&local_58,uVar9);
    pcVar4 = pcVar4 + 1;
    if (99 < uVar10) {
      do {
        uVar9 = (uint)uVar7;
        uVar10 = (uint)(uVar7 / 100);
        uVar7 = uVar7 / 100;
        *(undefined2 *)(pcVar4 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (ulong)(uVar9 + (int)uVar7 * -100) * 2);
        pcVar4 = pcVar4 + -2;
      } while (9999 < uVar9);
    }
    if (uVar10 < 10) {
      pcVar4[-1] = (byte)uVar10 | 0x30;
    }
    else {
      pcVar4[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [((ulong)uVar10 * 2 & 0xffffffff) + 1];
      pcVar4[-2] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [(ulong)uVar10 * 2];
    }
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}